

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsrcf.cpp
# Opt level: O1

CVmSrcfEntry * __thiscall CVmSrcfTable::add_entry(CVmSrcfTable *this,int orig_index,size_t name_len)

{
  size_t __size;
  ulong uVar1;
  ulong uVar2;
  CVmSrcfEntry *pCVar3;
  char *pcVar4;
  CVmSrcfEntry **ppCVar5;
  
  pCVar3 = (CVmSrcfEntry *)operator_new(0x28);
  uVar1 = this->list_used_;
  pCVar3->lines_ = (CVmSrcfLine *)0x0;
  pCVar3->lines_cnt_ = 0;
  pCVar3->lines_alo_ = 0;
  pCVar3->orig_index_ = orig_index;
  pCVar3->field_0xc = pCVar3->field_0xc & 0xfe | uVar1 == (uint)orig_index;
  pcVar4 = (char *)malloc(name_len + 1);
  pCVar3->name_buf_ = pcVar4;
  uVar2 = this->list_alloc_;
  if (uVar2 <= uVar1) {
    this->list_alloc_ = uVar2 + 10;
    __size = uVar2 * 8 + 0x50;
    if (this->list_ == (CVmSrcfEntry **)0x0) {
      ppCVar5 = (CVmSrcfEntry **)malloc(__size);
    }
    else {
      ppCVar5 = (CVmSrcfEntry **)realloc(this->list_,__size);
    }
    this->list_ = ppCVar5;
  }
  this->list_[this->list_used_] = pCVar3;
  this->list_used_ = this->list_used_ + 1;
  return pCVar3;
}

Assistant:

CVmSrcfEntry *CVmSrcfTable::add_entry(int orig_index, size_t name_len)
{
    CVmSrcfEntry *entry;
    
    /* allocate the new entry */
    entry = new CVmSrcfEntry(orig_index, (uint)orig_index == list_used_,
                             name_len);

    /* 
     *   make sure we have room in our list for a new entry; if not,
     *   expand the list 
     */
    if (list_used_ >= list_alloc_)
    {
        size_t siz;
        
        /* calculate the expanded list size */
        list_alloc_ += 10;
        siz = list_alloc_ * sizeof(list_[0]);

        /* allocate or reallocate the list */
        if (list_ == 0)
            list_ = (CVmSrcfEntry **)t3malloc(siz);
        else
            list_ = (CVmSrcfEntry **)t3realloc(list_, siz);
    }

    /* add the new entry */
    list_[list_used_] = entry;

    /* count the new entry */
    ++list_used_;

    /* return the new entry */
    return entry;
}